

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataflow.cpp
# Opt level: O1

Variable * __thiscall nwcpp::Dataflow::DeclareVariable(Dataflow *this,string *name)

{
  pointer pcVar1;
  Variable *this_00;
  ostream *poVar2;
  runtime_error *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nwcpp::Variable_*>_>,_bool>
  pVar3;
  stringstream msg;
  string asStack_1c8 [32];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  Variable *local_188;
  
  this_00 = (Variable *)operator_new(0x38);
  Variable::Variable(this_00,(Passkey)this,name);
  pcVar1 = (this_00->name_)._M_dataplus._M_p;
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,pcVar1,pcVar1 + (this_00->name_)._M_string_length);
  local_188 = this_00;
  pVar3 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nwcpp::Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,nwcpp::Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nwcpp::Variable*>>>
          ::_M_insert_unique<std::pair<std::__cxx11::string_const,nwcpp::Variable*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nwcpp::Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,nwcpp::Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nwcpp::Variable*>>>
                      *)this,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nwcpp::Variable_*>
                              *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
  }
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_1a8._0_8_ = this_00;
    std::
    vector<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>,std::allocator<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>>>
    ::emplace_back<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>>
              ((vector<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>,std::allocator<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>>>
                *)&this->nodes_,
               (unique_ptr<nwcpp::Node,_std::default_delete<nwcpp::Node>_> *)local_1a8);
    if ((Variable *)local_1a8._0_8_ != (Variable *)0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
    return this_00;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a8 + 0x10),"Duplicate variable name (\'",0x1a);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_1a8 + 0x10),(this_00->name_)._M_dataplus._M_p,
                      (this_00->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\')",2);
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_01,asStack_1c8);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Variable* Dataflow::DeclareVariable(const std::string& name) {
  Passkey passkey(this);
  auto var = std::make_unique<Variable>(passkey, name);
  const auto ptr = var.get();
  if (!variables_.insert({ var->name(), ptr }).second) {
    std::stringstream msg;
    msg << "Duplicate variable name ('" << var->name() << "')";
    throw std::runtime_error(msg.str());
  }
  nodes_.push_back(std::move(var));
  return ptr;
}